

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O3

void __thiscall
slang::ast::ASTSerializer::writeLink(ASTSerializer *this,string_view name,Symbol *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  uint uVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  Symbol *pSVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint uVar8;
  string_view value_00;
  string str;
  string __str;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  JsonWriter::writeProperty(this->writer,name);
  paVar1 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (this->includeAddrs == true) {
    uVar8 = 1;
    if ((Symbol *)&DAT_00000009 < value) {
      pSVar6 = value;
      uVar3 = 4;
      do {
        uVar8 = uVar3;
        if (pSVar6 < (Symbol *)0x64) {
          uVar8 = uVar8 - 2;
          goto LAB_001bd394;
        }
        if (pSVar6 < (Symbol *)0x3e8) {
          uVar8 = uVar8 - 1;
          goto LAB_001bd394;
        }
        if (pSVar6 < (Symbol *)0x2710) goto LAB_001bd394;
        bVar4 = (Symbol *)0x1869f < pSVar6;
        pSVar6 = (Symbol *)((ulong)pSVar6 / 10000);
        uVar3 = uVar8 + 4;
      } while (bVar4);
      uVar8 = uVar8 + 1;
    }
LAB_001bd394:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_50,(ulong)uVar8,'\0');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,(unsigned_long)value);
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_50," ");
    local_90._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar7 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar7) {
      local_90.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    local_90._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_70,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = Symbol::isType(value);
  if (bVar4) {
    Type::toString_abi_cxx11_(&local_90,(Type *)value);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_70,local_90._M_dataplus._M_p,local_90._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_001bd2bf;
  }
  else {
    pcVar2 = (value->name)._M_str;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,pcVar2,pcVar2 + (value->name)._M_len);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_70,local_90._M_dataplus._M_p,local_90._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_001bd2bf;
  }
  operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
LAB_001bd2bf:
  value_00._M_str = local_70._M_dataplus._M_p;
  value_00._M_len = local_70._M_string_length;
  JsonWriter::writeValue(this->writer,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ASTSerializer::writeLink(std::string_view name, const Symbol& value) {
    writer.writeProperty(name);

    std::string str;
    if (includeAddrs)
        str = std::to_string(uintptr_t(&value)) + " ";

    if (value.isType())
        str += value.as<Type>().toString();
    else
        str += std::string(value.name);

    writer.writeValue(str);
}